

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

void __thiscall fasttext::Vector::mul(Vector *this,Matrix *A,Vector *vec)

{
  uint __line;
  int64_t iVar1;
  pointer pfVar2;
  char *__assertion;
  long lVar3;
  float extraout_XMM0_Da;
  
  iVar1 = Matrix::size(A,0);
  if (iVar1 == (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) {
    iVar1 = Matrix::size(A,1);
    if (iVar1 == (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2) {
      pfVar2 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar3 = 0;
          lVar3 < (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pfVar2 >> 2; lVar3 = lVar3 + 1) {
        (*A->_vptr_Matrix[2])(A,vec,lVar3);
        pfVar2 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar2[lVar3] = extraout_XMM0_Da;
      }
      return;
    }
    __assertion = "A.size(1) == vec.size()";
    __line = 0x46;
  }
  else {
    __assertion = "A.size(0) == size()";
    __line = 0x45;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/vector.cc"
                ,__line,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
}

Assistant:

void Vector::mul(const Matrix& A, const Vector& vec) {
  assert(A.size(0) == size());
  assert(A.size(1) == vec.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] = A.dotRow(vec, i);
  }
}